

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PBool::PBool(PBool *this)

{
  PClass *pPVar1;
  long *plVar2;
  long *plVar3;
  undefined8 uVar4;
  PClass *pPVar5;
  undefined8 *puVar6;
  bool bVar7;
  
  PInt::PInt(&this->super_PInt,1,true);
  *(undefined ***)&this->super_PInt = &PTR_StaticType_008466f8;
  pPVar1 = PSymbolConstNumeric::RegistrationInfo.MyClass;
  plVar2 = (long *)((ulong)((*(int *)&(this->super_PInt).field_0x50 - 1U & 0x23b) * 0x18) +
                   *(long *)&(this->super_PInt).field_0x40);
  do {
    plVar3 = plVar2;
    if ((plVar3 == (long *)0x0) || ((long *)*plVar3 == (long *)0x1)) {
      plVar3 = (long *)0x0;
      break;
    }
    plVar2 = (long *)*plVar3;
  } while ((int)plVar3[1] != 0x23b);
  if (plVar3 == (long *)0x0) {
    puVar6 = (undefined8 *)0x0;
  }
  else {
    puVar6 = (undefined8 *)plVar3[2];
  }
  if (puVar6 != (undefined8 *)0x0) {
    if (puVar6[1] == 0) {
      uVar4 = (**(code **)*puVar6)(puVar6);
      puVar6[1] = uVar4;
    }
    pPVar5 = (PClass *)puVar6[1];
    bVar7 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar1 && bVar7) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar7 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar1) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (bVar7) {
      *(undefined4 *)(puVar6 + 6) = 1;
      return;
    }
  }
  __assert_fail("maxsym != NULL && maxsym->IsKindOf(RUNTIME_CLASS(PSymbolConstNumeric))",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                ,0x46a,"PBool::PBool()");
}

Assistant:

PBool::PBool()
: PInt(sizeof(bool), true)
{
	// Override the default max set by PInt's constructor
	PSymbolConstNumeric *maxsym = static_cast<PSymbolConstNumeric *>(Symbols.FindSymbol(NAME_Max, false));
	assert(maxsym != NULL && maxsym->IsKindOf(RUNTIME_CLASS(PSymbolConstNumeric)));
	maxsym->Value = 1;
}